

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.hpp
# Opt level: O1

Matrix_Sparse *
Disa::operator+(Matrix_Sparse *__return_storage_ptr__,Matrix_Sparse *matrix_0,
               Matrix_Sparse *matrix_1)

{
  pointer puVar1;
  pointer puVar2;
  source_location *psVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  source_location *location;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long lVar7;
  unsigned_long uVar8;
  long lVar9;
  size_type *local_1d8;
  size_type local_1d0;
  size_type local_1c8;
  undefined8 uStack_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar1 = (matrix_1->row_non_zero).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (matrix_1->row_non_zero).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  psVar3 = (source_location *)
           (matrix_0->row_non_zero).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  location = (source_location *)
             (matrix_0->row_non_zero).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  lVar7 = ((long)puVar2 - (long)puVar1 >> 3) + -1;
  if (puVar2 == puVar1) {
    lVar7 = 0;
  }
  lVar9 = ((long)location - (long)psVar3 >> 3) + -1;
  if (location == psVar3) {
    lVar9 = 0;
  }
  if ((lVar9 == lVar7) && (matrix_0->column_size == matrix_1->column_size)) {
    Matrix_Sparse::matrix_arithmetic<true>(matrix_0,matrix_1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&__return_storage_ptr__->row_non_zero,&matrix_0->row_non_zero);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&__return_storage_ptr__->column_index,&matrix_0->column_index);
    std::vector<double,_std::allocator<double>_>::vector
              (&__return_storage_ptr__->element_value,&matrix_0->element_value);
    __return_storage_ptr__->column_size = matrix_0->column_size;
    return __return_storage_ptr__;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  local_58 = &PTR_s__workspace_llm4binary_github_lic_0018c1a8;
  console_format_abi_cxx11_(&local_50,(Disa *)0x0,(Log_Level)&local_58,location);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_50._M_dataplus._M_p,local_50._M_string_length);
  puVar1 = (matrix_0->row_non_zero).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (matrix_0->row_non_zero).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = 0;
  if (puVar1 != puVar2) {
    uVar8 = ((long)puVar1 - (long)puVar2 >> 3) - 1;
  }
  std::__cxx11::to_string(&local_f8,uVar8);
  std::operator+(&local_d8,"Incompatible matrix dimensions, ",&local_f8);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d8,",");
  local_1b8._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar6 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p == paVar6) {
    local_1b8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  }
  else {
    local_1b8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_1b8._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string(&local_118,matrix_0->column_size);
  std::operator+(&local_b8,&local_1b8,&local_118);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_b8," vs. ");
  local_198._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar6 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p == paVar6) {
    local_198.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  }
  else {
    local_198.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_198._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  puVar1 = (matrix_1->row_non_zero).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (matrix_1->row_non_zero).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = ((long)puVar1 - (long)puVar2 >> 3) - 1;
  if (puVar1 == puVar2) {
    uVar8 = 0;
  }
  std::__cxx11::to_string(&local_138,uVar8);
  std::operator+(&local_98,&local_198,&local_138);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_98,",");
  local_178._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar6 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p == paVar6) {
    local_178.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_178.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  }
  else {
    local_178.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_178._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string(&local_158,matrix_1->column_size);
  std::operator+(&local_78,&local_178,&local_158);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_78,".");
  local_1d8 = (size_type *)(pbVar5->_M_dataplus)._M_p;
  paVar6 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8 == paVar6) {
    local_1c8 = paVar6->_M_allocated_capacity;
    uStack_1c0 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_1d8 = &local_1c8;
  }
  else {
    local_1c8 = paVar6->_M_allocated_capacity;
  }
  local_1d0 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1d8,local_1d0);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_50);
  exit(1);
}

Assistant:

inline Matrix_Sparse operator+(Matrix_Sparse matrix_0, const Matrix_Sparse& matrix_1) {
  ASSERT_DEBUG(matrix_0.size() == matrix_1.size(),
               "Incompatible matrix dimensions, " + std::to_string(matrix_0.size_row()) + "," +
               std::to_string(matrix_0.size_column()) + " vs. " + std::to_string(matrix_1.size_row()) + "," +
               std::to_string(matrix_1.size_column()) + ".");
  matrix_0 += matrix_1;
  return matrix_0;
}